

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

void Cec_ManSimMemRelink(Cec_ManSim_t *p)

{
  uint local_1c;
  int *piStack_18;
  uint Ent;
  uint *pPlace;
  Cec_ManSim_t *p_local;
  
  piStack_18 = &p->MemFree;
  for (local_1c = p->nMems * (p->nWords + 1); local_1c + p->nWords + 1 < (uint)p->nWordsAlloc;
      local_1c = p->nWords + 1 + local_1c) {
    *piStack_18 = local_1c;
    piStack_18 = (int *)(p->pMems + local_1c);
  }
  *piStack_18 = 0;
  p->nWordsOld = p->nWords;
  return;
}

Assistant:

void Cec_ManSimMemRelink( Cec_ManSim_t * p )
{
    unsigned * pPlace, Ent;
    pPlace = (unsigned *)&p->MemFree;
    for ( Ent = p->nMems * (p->nWords + 1); 
          Ent + p->nWords + 1 < (unsigned)p->nWordsAlloc; 
          Ent += p->nWords + 1 )
    {
        *pPlace = Ent;
        pPlace = p->pMems + Ent;
    }
    *pPlace = 0;
    p->nWordsOld = p->nWords;
}